

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_fm.hpp
# Opt level: O0

bool __thiscall
ymfm::fm_channel<ymfm::opn_registers_base<true>_>::prepare
          (fm_channel<ymfm::opn_registers_base<true>_> *this)

{
  bool bVar1;
  uint32_t uVar2;
  uint local_18;
  uint local_14;
  uint32_t opnum;
  uint32_t active_mask;
  fm_channel<ymfm::opn_registers_base<true>_> *this_local;
  
  local_14 = 0;
  for (local_18 = 0;
      uVar2 = array_size<ymfm::fm_operator<ymfm::opn_registers_base<true>>*,4>(&this->m_op),
      local_18 < uVar2; local_18 = local_18 + 1) {
    if ((this->m_op[local_18] != (fm_operator<ymfm::opn_registers_base<true>_> *)0x0) &&
       (bVar1 = fm_operator<ymfm::opn_registers_base<true>_>::prepare(this->m_op[local_18]), bVar1))
    {
      local_14 = 1 << ((byte)local_18 & 0x1f) | local_14;
    }
  }
  return local_14 != 0;
}

Assistant:

bool fm_channel<RegisterType>::prepare()
{
	uint32_t active_mask = 0;

	// prepare all operators and determine if they are active
	for (uint32_t opnum = 0; opnum < array_size(m_op); opnum++)
		if (m_op[opnum] != nullptr)
			if (m_op[opnum]->prepare())
				active_mask |= 1 << opnum;

	return (active_mask != 0);
}